

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.cpp
# Opt level: O2

size_t pstore::command_line::details::widest_option(categories_collection *categories)

{
  ulong uVar1;
  _Base_ptr p_Var2;
  size_t sVar3;
  options_set *in_RDX;
  long lVar4;
  ulong uVar5;
  _Base_ptr p_Var6;
  undefined1 auVar7 [16];
  _Rb_tree<pstore::gsl::not_null<const_pstore::command_line::option_*>,_std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>,_std::_Select1st<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
  _Stack_58;
  
  uVar5 = 0;
  p_Var6 = (categories->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var6 != &(categories->_M_t)._M_impl.super__Rb_tree_header) {
    get_switch_strings_abi_cxx11_
              ((switch_strings *)&_Stack_58,(details *)&p_Var6[1]._M_parent,in_RDX);
    for (p_Var2 = _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &_Stack_58._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      for (lVar4 = 0; (long)p_Var2[1]._M_parent * 0x28 - lVar4 != 0; lVar4 = lVar4 + 0x28) {
        uVar1 = *(ulong *)((long)&(p_Var2[3]._M_left)->_M_color + lVar4);
        if (uVar5 <= uVar1) {
          uVar5 = uVar1;
        }
      }
    }
    std::
    _Rb_tree<pstore::gsl::not_null<const_pstore::command_line::option_*>,_std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>,_std::_Select1st<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
    ::~_Rb_tree(&_Stack_58);
    auVar7 = std::_Rb_tree_increment(p_Var6);
    in_RDX = auVar7._8_8_;
    p_Var6 = auVar7._0_8_;
  }
  sVar3 = 0x14;
  if (uVar5 < 0x14) {
    sVar3 = uVar5;
  }
  return sVar3;
}

Assistant:

std::size_t widest_option (categories_collection const & categories) {
                    auto max_name_len = std::size_t{0};
                    for (auto const & cat : categories) {
                        for (auto const & sw : get_switch_strings (cat.second)) {
                            for (std::tuple<std::string, std::size_t> const & name : sw.second) {
                                max_name_len =
                                    std::max (max_name_len, std::get<std::size_t> (name));
                            }
                        }
                    }
                    return std::min (max_name_len, overlong_opt_max);
                }